

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O2

void __thiscall DHUDMessage::Serialize(DHUDMessage *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = FArchive::operator<<(arc,&this->Left);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Top);
  pFVar1 = FArchive::operator<<(pFVar1,&this->CenterX);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->HoldTics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->Tics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->State);
  pFVar1 = ::operator<<(pFVar1,&this->TextColor);
  pFVar1 = FArchive::operator<<(pFVar1,&this->SBarID);
  pFVar1 = FArchive::operator<<(pFVar1,&this->SourceText);
  pFVar1 = SerializeFFontPtr(pFVar1,&this->Font);
  pFVar1 = ::operator<<(pFVar1,(DHUDMessage **)&this->Next);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->HUDWidth);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->HUDHeight);
  pFVar1 = FArchive::operator<<(pFVar1,&this->NoWrap);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipX);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipY);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipWidth);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipHeight);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->WrapWidth);
  pFVar1 = FArchive::operator<<(pFVar1,&this->HandleAspect);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->VisibilityFlags);
  pFVar1 = ::operator<<(pFVar1,&this->Style);
  FArchive::operator<<(pFVar1,&this->Alpha);
  if (arc->m_Loading == true) {
    this->Lines = (FBrokenLines *)0x0;
    (*(this->super_DObject)._vptr_DObject[7])(this,this->SourceText);
    return;
  }
  return;
}

Assistant:

void DHUDMessage::Serialize(FArchive &arc)
{
	Super::Serialize(arc);
	arc << Left << Top << CenterX << HoldTics
		<< Tics << State << TextColor
		<< SBarID << SourceText << Font << Next
		<< HUDWidth << HUDHeight
		<< NoWrap
		<< ClipX << ClipY << ClipWidth << ClipHeight
		<< WrapWidth
		<< HandleAspect
		<< VisibilityFlags
		<< Style << Alpha;
	if (arc.IsLoading())
	{
		Lines = NULL;
		ResetText(SourceText);
	}
}